

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_log_sync_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  runtime_error *this_00;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined1 auVar9 [16];
  ptr<resp_msg> pVar10;
  long *local_50 [2];
  long local_40 [2];
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  puVar6 = (undefined8 *)operator_new(0x40);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_0017a728;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar6[3] = peVar3;
  *(undefined4 *)(puVar6 + 4) = 0xb;
  *(undefined4 *)((long)puVar6 + 0x24) = uVar2;
  *(undefined4 *)(puVar6 + 5) = uVar1;
  puVar6[2] = &PTR__msg_base_0017a778;
  puVar6[6] = 0;
  *(undefined1 *)(puVar6 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar6;
  this->_vptr_raft_server = (_func_int **)(puVar6 + 2);
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (lVar7 = **(long **)(in_RDX + 0x38), *(int *)(lVar7 + 8) == 4)) {
    if (*(char *)((long)&req->last_log_idx_ + 2) != '\0') {
      if (*(long *)(lVar7 + 0x18) == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"get_buf cannot be called for a log_entry with nil buffer");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pp_Var4 = req[4].super_msg_base._vptr_msg_base;
      (**(code **)(*pp_Var4 + 0x58))(pp_Var4,*(long *)(in_RDX + 0x28) + 1);
      lVar7 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      commit((raft_server *)req,lVar7 - 1);
      auVar9 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var8._M_pi = auVar9._8_8_;
      puVar6[6] = auVar9._0_8_;
      *(undefined1 *)(puVar6 + 7) = 1;
      goto LAB_0014f25e;
    }
    plVar5 = (long *)req[4].last_log_term_;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"This server is ready for cluster, ignore the request","");
    (**(code **)(*plVar5 + 0x18))(plVar5,local_50);
    _Var8._M_pi = extraout_RDX_01;
  }
  else {
    plVar5 = (long *)req[4].last_log_term_;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "receive an invalid LogSyncRequest as the log entry value doesn\'t meet the requirements"
               ,"");
    (**(code **)(*plVar5 + 0x18))(plVar5,local_50);
    _Var8._M_pi = extraout_RDX;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    _Var8._M_pi = extraout_RDX_00;
  }
LAB_0014f25e:
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_log_sync_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::sync_log_response, id_, req.get_src()));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::log_pack)
    {
        l_->info("receive an invalid LogSyncRequest as the log entry value doesn't meet the requirements");
        return resp;
    }

    if (!catching_up_)
    {
        l_->info("This server is ready for cluster, ignore the request");
        return resp;
    }

    log_store_->apply_pack(req.get_last_log_idx() + 1, entries[0]->get_buf());
    commit(log_store_->next_slot() - 1);
    resp->accept(log_store_->next_slot());
    return resp;
}